

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::Flush(FileStdio *this)

{
  int iVar1;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  WaitForOpen(this);
  std::__cxx11::string::string((string *)&local_40,"write",(allocator *)&local_100);
  Transport::ProfilerStart(&this->super_Transport,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = fflush((FILE *)this->m_File);
  std::__cxx11::string::string((string *)&local_60,"write",(allocator *)&local_100);
  Transport::ProfilerStop(&this->super_Transport,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_100,"Toolkit",&local_101);
    std::__cxx11::string::string((string *)&local_80,"transport::file::FileStdio",&local_102);
    std::__cxx11::string::string((string *)&local_a0,"Flush",&local_103);
    std::operator+(&local_e0,"couldn\'t flush file ",&(this->super_Transport).m_Name);
    std::operator+(&local_c0,&local_e0,", in call to stdio fflush");
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_100,&local_80,&local_a0,&local_c0,-1);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return;
}

Assistant:

void FileStdio::Flush()
{
    WaitForOpen();
    ProfilerStart("write");
    const int status = std::fflush(m_File);
    ProfilerStop("write");

    if (status == EOF)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Flush",
                                              "couldn't flush file " + m_Name +
                                                  ", in call to stdio fflush");
    }
}